

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

int __thiscall
mp::internal::BinaryReader<mp::internal::EndiannessConverter>::ReadInt<int>
          (BinaryReader<mp::internal::EndiannessConverter> *this)

{
  undefined1 uVar1;
  int iVar2;
  int *piVar3;
  undefined1 *puVar4;
  long lVar5;
  undefined1 local_4 [4];
  
  (this->super_BinaryReaderBase).super_ReaderBase.token_ =
       (this->super_BinaryReaderBase).super_ReaderBase.ptr_;
  piVar3 = (int *)BinaryReaderBase::Read(&this->super_BinaryReaderBase,4);
  iVar2 = *piVar3;
  puVar4 = local_4 + 3;
  lVar5 = 0;
  do {
    uVar1 = local_4[lVar5];
    local_4[lVar5] = *puVar4;
    *puVar4 = uVar1;
    lVar5 = lVar5 + 1;
    puVar4 = puVar4 + -1;
  } while (lVar5 != 2);
  return iVar2;
}

Assistant:

Int ReadInt() {
    token_ = ptr_;
    Int val;
    memcpy(&val, Read(sizeof(Int)), sizeof(Int));
    return this->Convert(val);
  }